

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsectoreffect.cpp
# Opt level: O2

void __thiscall
DMovingCeiling::DMovingCeiling(DMovingCeiling *this,sector_t_conflict *sector,bool interpolate)

{
  DInterpolation *pDVar1;
  undefined7 in_register_00000011;
  
  DMover::DMover(&this->super_DMover,sector);
  (this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_006eedc8;
  (sector->ceilingdata).field_0.p = (DSectorEffect *)this;
  if ((int)CONCAT71(in_register_00000011,interpolate) != 0) {
    pDVar1 = sector_t::SetInterpolation((sector_t *)sector,0,true);
    (this->super_DMover).interpolation.field_0.p = pDVar1;
  }
  return;
}

Assistant:

DMovingCeiling::DMovingCeiling (sector_t *sector, bool interpolate)
	: DMover (sector)
{
	sector->ceilingdata = this;
	if (interpolate) interpolation = sector->SetInterpolation(sector_t::CeilingMove, true);
}